

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int function_definition(void)

{
  int iVar1;
  sym_t *s_00;
  sym_t *s;
  sym_t *in_stack_ffffffffffffffe8;
  
  s_00 = create_sym();
  backtrace_prepare();
  iVar1 = declarator(in_stack_ffffffffffffffe8);
  if (iVar1 == 0) {
    iVar1 = declaration_specifiers(in_stack_ffffffffffffffe8);
    if ((iVar1 != 0) && (iVar1 = declarator(in_stack_ffffffffffffffe8), iVar1 != 0)) {
      if (s_00->function == 0) {
        backtrace();
        free(s_00);
        return 0;
      }
      if (t->id == 0x7b) {
        syms_add(s_00);
        function(s_00->id);
        ast_add_node((node_t)0x105fa1);
        compound_statement();
        return 1;
      }
    }
  }
  else {
    if (s_00->function == 0) {
      backtrace();
      free(s_00);
      return 0;
    }
    if (t->id == 0x7b) {
      syms_add(s_00);
      function(s_00->id);
      ast_add_node((node_t)0x105f23);
      compound_statement();
      return 1;
    }
  }
  backtrace();
  free(s_00);
  return 0;
}

Assistant:

int function_definition()
{
    sym_t* s = create_sym();
    backtrace_prepare();

    if (declarator(s))
    {
        if (!s->function)
        {
            backtrace();
            free(s);
            return 0;
        }

        if (t->id == '{')
        {
            syms_add(s);
            ast_add_node(function(s->id));
            compound_statement();
            return 1;
        }
    }
    else if (declaration_specifiers(s))
    {
        if (declarator(s))
        {
            if (!s->function)
            {
                backtrace();
                free(s);
                return 0;
            }

            if (t->id == '{')
            {
                syms_add(s);
                ast_add_node(function(s->id));
                compound_statement();
                return 1;
            }
        }
    }

    backtrace();
    free(s);
    return 0;
}